

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<unsigned_short>,ImPlot::GetterXsYRef<unsigned_short>,ImPlot::TransformerLogLog>
               (GetterXsYs<unsigned_short> *getter1,GetterXsYRef<unsigned_short> *getter2,
               TransformerLogLog *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ushort uVar7;
  int iVar8;
  ImPlotPlot *pIVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  int local_6c;
  ImDrawList *local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterXsYRef<unsigned_short> *local_50;
  TransformerLogLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_68 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,ImPlot::GetterXsYRef<unsigned_short>,ImPlot::TransformerLogLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_6c = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_6c = getter1->Count;
    }
    if (0 < local_6c) {
      iVar15 = 0;
      do {
        pIVar12 = GImPlot;
        iVar8 = getter1->Count;
        lVar14 = (long)(((getter1->Offset + iVar15) % iVar8 + iVar8) % iVar8) *
                 (long)getter1->Stride;
        uVar7 = *(ushort *)((long)getter1->Ys + lVar14);
        dVar10 = log10((double)*(ushort *)((long)getter1->Xs + lVar14) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar3 = pIVar12->LogDenX;
        pIVar9 = pIVar12->CurrentPlot;
        dVar4 = (pIVar9->XAxis).Range.Min;
        dVar5 = (pIVar9->XAxis).Range.Max;
        dVar11 = log10((double)uVar7 / pIVar9->YAxis[transformer->YAxis].Range.Min);
        pIVar13 = GImPlot;
        iVar8 = transformer->YAxis;
        pIVar9 = pIVar12->CurrentPlot;
        dVar6 = pIVar9->YAxis[iVar8].Range.Min;
        local_58._0_4_ =
             (undefined4)
             ((((double)(float)(dVar10 / dVar3) * (dVar5 - dVar4) + dVar4) -
              (pIVar9->XAxis).Range.Min) * pIVar12->Mx + (double)pIVar12->PixelRange[iVar8].Min.x);
        local_58._4_4_ =
             (float)((((double)(float)(dVar11 / pIVar12->LogDenY[iVar8]) *
                       (pIVar9->YAxis[iVar8].Range.Max - dVar6) + dVar6) - dVar6) *
                     pIVar12->My[iVar8] + (double)pIVar12->PixelRange[iVar8].Min.y);
        iVar8 = getter2->Count;
        dVar3 = getter2->YRef;
        dVar10 = log10((double)*(ushort *)
                                ((long)getter2->Xs +
                                (long)(((getter2->Offset + iVar15) % iVar8 + iVar8) % iVar8) *
                                (long)getter2->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar4 = pIVar13->LogDenX;
        pIVar9 = pIVar13->CurrentPlot;
        dVar5 = (pIVar9->XAxis).Range.Min;
        dVar6 = (pIVar9->XAxis).Range.Max;
        dVar11 = log10(dVar3 / pIVar9->YAxis[transformer->YAxis].Range.Min);
        iVar8 = transformer->YAxis;
        pIVar9 = pIVar13->CurrentPlot;
        dVar3 = pIVar9->YAxis[iVar8].Range.Min;
        local_78.x = (float)((((double)(float)(dVar10 / dVar4) * (dVar6 - dVar5) + dVar5) -
                             (pIVar9->XAxis).Range.Min) * pIVar13->Mx +
                            (double)pIVar13->PixelRange[iVar8].Min.x);
        fVar16 = (float)((((double)(float)(dVar11 / pIVar13->LogDenY[iVar8]) *
                           (pIVar9->YAxis[iVar8].Range.Max - dVar3) + dVar3) - dVar3) *
                         pIVar13->My[iVar8] + (double)pIVar13->PixelRange[iVar8].Min.y);
        local_78.y = fVar16;
        pIVar9 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar16 <= (float)local_58._4_4_) {
          fVar2 = fVar16;
        }
        if ((fVar2 < (pIVar9->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar16 <= (float)local_58._4_4_) & (uint)fVar16 |
                           local_58._4_4_ & -(uint)(fVar16 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar9->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_78.x <= (float)local_58._0_4_) {
            fVar2 = local_78.x;
          }
          if ((fVar2 < (pIVar9->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_78.x <= (float)local_58._0_4_) & (uint)local_78.x |
                             local_58._0_4_ & -(uint)(local_78.x <= (float)local_58._0_4_)),
             (pIVar9->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar9->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_78,col,line_weight);
          }
        }
        iVar15 = iVar15 + 1;
      } while (local_6c != iVar15);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}